

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

void __thiscall
TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Resize
          (TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,int64_t newsize,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *object)

{
  long *plVar1;
  long *plVar2;
  int64_t *piVar3;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize.",0x26);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    std::ostream::flush();
    return;
  }
  lVar4 = this->fNElements;
  if (lVar4 != newsize) {
    if (newsize == 0) {
      pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    else {
      uVar6 = newsize << 5;
      piVar3 = (int64_t *)operator_new__(-(ulong)((ulong)newsize >> 0x3b != 0) | uVar6 | 8);
      *piVar3 = newsize;
      pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(piVar3 + 1);
      piVar3 = piVar3 + 3;
      do {
        piVar3[-2] = (int64_t)piVar3;
        piVar3[-1] = 0;
        *(undefined1 *)piVar3 = 0;
        piVar3 = piVar3 + 4;
        uVar6 = uVar6 - 0x20;
      } while (uVar6 != 0);
    }
    if (newsize <= lVar4) {
      lVar4 = newsize;
    }
    if (lVar4 < 1) {
      lVar4 = 0;
    }
    else {
      lVar7 = 0;
      lVar8 = lVar4;
      do {
        std::__cxx11::string::_M_assign((string *)((long)&(pbVar9->_M_dataplus)._M_p + lVar7));
        lVar7 = lVar7 + 0x20;
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
    }
    lVar8 = newsize - lVar4;
    if (lVar8 != 0 && lVar4 <= newsize) {
      pbVar5 = pbVar9 + lVar4;
      do {
        std::__cxx11::string::_M_assign((string *)pbVar5);
        pbVar5 = pbVar5 + 1;
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
    }
    pbVar5 = this->fStore;
    if (pbVar5 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      lVar4 = *(long *)((long)&pbVar5[-1].field_2 + 8);
      if (lVar4 != 0) {
        lVar8 = lVar4 << 5;
        do {
          plVar1 = (long *)((long)pbVar5 + lVar8 + -0x10);
          plVar2 = *(long **)((long)&pbVar5[-1]._M_dataplus._M_p + lVar8);
          if (plVar1 != plVar2) {
            operator_delete(plVar2,*plVar1 + 1);
          }
          lVar8 = lVar8 + -0x20;
        } while (lVar8 != 0);
      }
      operator_delete__((void *)((long)&pbVar5[-1].field_2 + 8),lVar4 << 5 | 8);
    }
    this->fStore = pbVar9;
    this->fNElements = newsize;
    this->fNAlloc = newsize;
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize,const T& object) {
#ifndef PZNODEBUG
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize." << std::endl;
		PZError.flush();
		return;
	}
#endif
	if(newsize == fNElements) return;
	T* newstore;
	if(newsize) newstore = new T[newsize];
	else newstore = 0;
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	for(;i<newsize;i++) {   // then only to case : large=fNElement < newsize
		newstore[i] = object;
	}
    if(fStore) {
        delete[] fStore;
        fStore = nullptr;
    }
	fStore = newstore;
	fNElements = newsize;//cedric 20/11/99 e 29/04/00
    fNAlloc = newsize;
}